

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * NULLCString::strstr(char *__haystack,char *__needle)

{
  char *pcVar1;
  int in_ECX;
  char *in_RDX;
  char *pos;
  NULLCArray substring_local;
  NULLCArray string_local;
  
  if (__haystack == (char *)0x0) {
    nullcThrowError("string is null");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else if (in_RDX == (char *)0x0) {
    nullcThrowError("substring is null");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else if (((int)__needle == 0) || (__haystack[(int)__needle - 1] != '\0')) {
    nullcThrowError("string is not null-terminated");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else if ((in_ECX == 0) || (in_RDX[in_ECX - 1] != '\0')) {
    nullcThrowError("substring is not null-terminated");
    string_local.ptr._4_4_ = 0xffffffff;
  }
  else {
    pcVar1 = ::strstr(__haystack,in_RDX);
    if (pcVar1 == (char *)0x0) {
      string_local.ptr._4_4_ = 0xffffffff;
    }
    else {
      string_local.ptr._4_4_ = (int)pcVar1 - (int)__haystack;
    }
  }
  return (char *)(ulong)string_local.ptr._4_4_;
}

Assistant:

int strstr(NULLCArray string, NULLCArray substring)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		if(!substring.ptr)
		{
			nullcThrowError("substring is null");
			return -1;
		}

		if(string.len == 0 || string.ptr[string.len - 1])
		{
			nullcThrowError("string is not null-terminated");
			return -1;
		}

		if(substring.len == 0 || substring.ptr[substring.len - 1])
		{
			nullcThrowError("substring is not null-terminated");
			return -1;
		}

		if(const char *pos = ::strstr(string.ptr, substring.ptr))
			return int(pos - string.ptr);

		return -1;
	}